

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall luna::SemanticAnalysisVisitor::DeleteCurrentBlock(SemanticAnalysisVisitor *this)

{
  undefined8 *puVar1;
  long in_RDI;
  bool bVar2;
  LexicalBlock *block;
  
  bVar2 = false;
  if (*(long *)(in_RDI + 0x10) != 0) {
    bVar2 = *(long *)(*(long *)(in_RDI + 0x10) + 8) != 0;
  }
  if (!bVar2) {
    __assert_fail("current_function_ && current_function_->current_block_",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                  ,0xbf,"void luna::SemanticAnalysisVisitor::DeleteCurrentBlock()");
  }
  puVar1 = *(undefined8 **)(*(long *)(in_RDI + 0x10) + 8);
  *(undefined8 *)(*(long *)(in_RDI + 0x10) + 8) = *puVar1;
  if (puVar1 != (undefined8 *)0x0) {
    LexicalBlock::~LexicalBlock((LexicalBlock *)0x1edf9a);
    operator_delete(puVar1);
  }
  return;
}

Assistant:

void DeleteCurrentBlock()
        {
            assert(current_function_ && current_function_->current_block_);
            auto block = current_function_->current_block_;
            current_function_->current_block_ = block->parent_;
            delete block;
        }